

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_DistributionMapping.cpp
# Opt level: O0

void __thiscall
amrex::DistributionMapping::LeastUsedCPUs
          (DistributionMapping *this,int nprocs,Vector<int,_std::allocator<int>_> *result)

{
  int *piVar1;
  int in_ESI;
  size_type in_RDI;
  vector<int,_std::allocator<int>_> *unaff_retaddr;
  int i;
  size_type in_stack_ffffffffffffffd8;
  int iVar2;
  int iVar3;
  
  std::vector<int,_std::allocator<int>_>::resize(unaff_retaddr,in_RDI);
  iVar2 = 0;
  while (iVar2 < in_ESI) {
    iVar3 = iVar2;
    piVar1 = Vector<int,_std::allocator<int>_>::operator[]
                       ((Vector<int,_std::allocator<int>_> *)CONCAT44(iVar2,iVar2),
                        in_stack_ffffffffffffffd8);
    *piVar1 = iVar2;
    iVar2 = iVar3 + 1;
  }
  return;
}

Assistant:

void
DistributionMapping::LeastUsedCPUs (int         nprocs,
                                    Vector<int>& result)
{
    result.resize(nprocs);

#ifdef BL_USE_MPI
    BL_PROFILE("DistributionMapping::LeastUsedCPUs()");

    AMREX_ASSERT(nprocs <= ParallelContext::NProcsSub());

    Vector<Long> bytes(ParallelContext::NProcsSub());
    Long thisbyte = amrex::TotalBytesAllocatedInFabs()/1024;
    ParallelAllGather::AllGather(thisbyte, bytes.dataPtr(), ParallelContext::CommunicatorSub());

    std::vector<LIpair> LIpairV;

    LIpairV.reserve(nprocs);

    for (int i(0); i < nprocs; ++i)
    {
        LIpairV.push_back(LIpair(bytes[i],i));
    }

    bytes.clear();

    Sort(LIpairV, false);

    for (int i(0); i < nprocs; ++i)
    {
        result[i] = LIpairV[i].second;
    }

    if (flag_verbose_mapper) {
        Print() << "LeastUsedCPUs:" << std::endl;
        for (const auto &p : LIpairV) {
            Print() << "  Rank " << p.second << " contains " << p.first << std::endl;
        }
    }
#else
    for (int i(0); i < nprocs; ++i)
    {
        result[i] = i;
    }
#endif
}